

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall Client::handleGetNNewPostsRequest(Client *this,GetNNewPostsRequest request)

{
  CommunicationStack *pCVar1;
  bool bVar2;
  int __val;
  reference pPVar3;
  reference pvVar4;
  string *val;
  Event EVar5;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1b0;
  GetNNewPostsResponse local_1a0;
  undefined1 local_188 [32];
  __cxx11 local_168 [32];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_148;
  undefined1 local_138 [8];
  Post post;
  iterator __end1;
  iterator __begin1;
  vector<Post,_std::allocator<Post>_> *__range1;
  json j_post;
  json j_array;
  DatabaseException *e;
  undefined1 local_78 [8];
  vector<Post,_std::allocator<Post>_> posts;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_50;
  GetNNewPostsResponse local_40;
  GetNNewPostsResponse local_28;
  Client *this_local;
  GetNNewPostsRequest request_local;
  
  local_28.data.m_value = (json_value)this;
  this_local._4_4_ = request.numberOfPosts;
  if (this->user == (User *)0x0) {
    pCVar1 = this->communicationStack;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[1],_char[1],_0>(&local_50,(char (*) [1])0x1fc646);
    GetNNewPostsResponse::GetNNewPostsResponse(&local_40,false,&local_50);
    EVar5 = GetNNewPostsResponse::operator_cast_to_basic_json(&local_28);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_28,EVar5.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&local_28);
    GetNNewPostsResponse::~GetNNewPostsResponse(&local_40);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_50);
  }
  else {
    std::vector<Post,_std::allocator<Post>_>::vector
              ((vector<Post,_std::allocator<Post>_> *)local_78);
    Database::getNNewestPosts
              ((vector<Post,_std::allocator<Post>_> *)&e,&server.database,this_local._4_4_);
    std::vector<Post,_std::allocator<Post>_>::operator=
              ((vector<Post,_std::allocator<Post>_> *)local_78,
               (vector<Post,_std::allocator<Post>_> *)&e);
    std::vector<Post,_std::allocator<Post>_>::~vector((vector<Post,_std::allocator<Post>_> *)&e);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&j_post.m_value,(nullptr_t)0x0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&__range1,(nullptr_t)0x0);
    __end1 = std::vector<Post,_std::allocator<Post>_>::begin
                       ((vector<Post,_std::allocator<Post>_> *)local_78);
    post._32_8_ = std::vector<Post,_std::allocator<Post>_>::end
                            ((vector<Post,_std::allocator<Post>_> *)local_78);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<Post_*,_std::vector<Post,_std::allocator<Post>_>_>
                                  *)&post.field_0x20);
      if (!bVar2) break;
      pPVar3 = __gnu_cxx::__normal_iterator<Post_*,_std::vector<Post,_std::allocator<Post>_>_>::
               operator*(&__end1);
      Post::Post((Post *)local_138,pPVar3);
      __val = Post::getId((Post *)local_138);
      std::__cxx11::to_string(local_168,__val);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&__range1,"id");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(pvVar4,&local_148);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_148);
      std::__cxx11::string::~string((string *)local_168);
      val = Post::getContent_abi_cxx11_((Post *)local_138);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)(local_188 + 0x10),val);
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&__range1,"content");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(pvVar4,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)(local_188 + 0x10));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(local_188 + 0x10));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&j_post.m_value,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&__range1);
      Post::~Post((Post *)local_138);
      __gnu_cxx::__normal_iterator<Post_*,_std::vector<Post,_std::allocator<Post>_>_>::operator++
                (&__end1);
    }
    pCVar1 = this->communicationStack;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&local_1b0,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&j_post.m_value);
    GetNNewPostsResponse::GetNNewPostsResponse(&local_1a0,true,&local_1b0);
    EVar5 = GetNNewPostsResponse::operator_cast_to_basic_json((GetNNewPostsResponse *)local_188);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,local_188,EVar5.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_188);
    GetNNewPostsResponse::~GetNNewPostsResponse(&local_1a0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_1b0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&__range1);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&j_post.m_value);
    std::vector<Post,_std::allocator<Post>_>::~vector
              ((vector<Post,_std::allocator<Post>_> *)local_78);
  }
  return;
}

Assistant:

void Client::handleGetNNewPostsRequest(GetNNewPostsRequest request)
{
	if(user == nullptr)
	{
		communicationStack->sendEvent(GetNNewPostsResponse(false, ""));
		return;
	}

	std::vector<Post> posts;

	try
	{
		posts = server.database.getNNewestPosts(request.numberOfPosts);
	}
	catch (DatabaseException& e)
	{
		std::cout << e.what() << std::endl;
		communicationStack->sendEvent(GetNNewPostsResponse(false, ""));
		return;
	}

	json j_array;
	json j_post;

	for(auto post: posts)
	{
		j_post["id"] = std::to_string(post.getId());
		j_post["content"] = post.getContent();
		j_array.push_back(j_post);
	}

	communicationStack->sendEvent(GetNNewPostsResponse(true, j_array));
}